

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O0

void acmod_activate_hmm(acmod_t *acmod,hmm_t *hmm)

{
  byte bVar1;
  uint uVar2;
  uint local_b4;
  uint local_9c;
  uint local_84;
  uint local_6c;
  uint local_54;
  uint local_3c;
  int local_1c;
  int i;
  hmm_t *hmm_local;
  acmod_t *acmod_local;
  
  if (acmod->compallsen == '\0') {
    if (hmm->mpx == '\0') {
      if (hmm->n_emit_state != '\x03') {
        if (hmm->n_emit_state != '\x05') {
          for (local_1c = 0; local_1c < (int)(uint)hmm->n_emit_state; local_1c = local_1c + 1) {
            uVar2 = hmm->senid[local_1c] / 0x20;
            acmod->senone_active_vec[(int)uVar2] =
                 acmod->senone_active_vec[(int)uVar2] |
                 (uint)(1L << ((byte)hmm->senid[local_1c] & 0x1f));
          }
          return;
        }
        uVar2 = hmm->senid[4] / 0x20;
        acmod->senone_active_vec[(int)uVar2] =
             acmod->senone_active_vec[(int)uVar2] | (uint)(1L << ((byte)hmm->senid[4] & 0x1f));
        uVar2 = hmm->senid[3] / 0x20;
        acmod->senone_active_vec[(int)uVar2] =
             acmod->senone_active_vec[(int)uVar2] | (uint)(1L << ((byte)hmm->senid[3] & 0x1f));
      }
      uVar2 = hmm->senid[2] / 0x20;
      acmod->senone_active_vec[(int)uVar2] =
           acmod->senone_active_vec[(int)uVar2] | (uint)(1L << ((byte)hmm->senid[2] & 0x1f));
      uVar2 = hmm->senid[1] / 0x20;
      acmod->senone_active_vec[(int)uVar2] =
           acmod->senone_active_vec[(int)uVar2] | (uint)(1L << ((byte)hmm->senid[1] & 0x1f));
      uVar2 = hmm->senid[0] / 0x20;
      acmod->senone_active_vec[(int)uVar2] =
           acmod->senone_active_vec[(int)uVar2] | (uint)(1L << ((byte)hmm->senid[0] & 0x1f));
    }
    else {
      if (hmm->n_emit_state != '\x03') {
        if (hmm->n_emit_state != '\x05') {
          for (local_1c = 0; local_1c < (int)(uint)hmm->n_emit_state; local_1c = local_1c + 1) {
            if (hmm->senid[local_1c] != 0xffff) {
              if (hmm->senid[local_1c] == 0xffff) {
                bVar1 = 0xff;
              }
              else {
                bVar1 = (byte)hmm->ctx->sseq[hmm->senid[local_1c]][local_1c];
              }
              if (hmm->senid[local_1c] == 0xffff) {
                local_b4 = 0xffff;
              }
              else {
                local_b4 = (uint)hmm->ctx->sseq[hmm->senid[local_1c]][local_1c];
              }
              acmod->senone_active_vec[(int)(local_b4 / 0x20)] =
                   acmod->senone_active_vec[(int)(local_b4 / 0x20)] | (uint)(1L << (bVar1 & 0x1f));
            }
          }
          return;
        }
        if (hmm->senid[4] != 0xffff) {
          if (hmm->senid[4] == 0xffff) {
            bVar1 = 0xff;
          }
          else {
            bVar1 = (byte)hmm->ctx->sseq[hmm->senid[4]][4];
          }
          if (hmm->senid[4] == 0xffff) {
            local_3c = 0xffff;
          }
          else {
            local_3c = (uint)hmm->ctx->sseq[hmm->senid[4]][4];
          }
          acmod->senone_active_vec[(int)(local_3c / 0x20)] =
               acmod->senone_active_vec[(int)(local_3c / 0x20)] | (uint)(1L << (bVar1 & 0x1f));
        }
        if (hmm->senid[3] != 0xffff) {
          if (hmm->senid[3] == 0xffff) {
            bVar1 = 0xff;
          }
          else {
            bVar1 = (byte)hmm->ctx->sseq[hmm->senid[3]][3];
          }
          if (hmm->senid[3] == 0xffff) {
            local_54 = 0xffff;
          }
          else {
            local_54 = (uint)hmm->ctx->sseq[hmm->senid[3]][3];
          }
          acmod->senone_active_vec[(int)(local_54 / 0x20)] =
               acmod->senone_active_vec[(int)(local_54 / 0x20)] | (uint)(1L << (bVar1 & 0x1f));
        }
      }
      if (hmm->senid[2] != 0xffff) {
        if (hmm->senid[2] == 0xffff) {
          bVar1 = 0xff;
        }
        else {
          bVar1 = (byte)hmm->ctx->sseq[hmm->senid[2]][2];
        }
        if (hmm->senid[2] == 0xffff) {
          local_6c = 0xffff;
        }
        else {
          local_6c = (uint)hmm->ctx->sseq[hmm->senid[2]][2];
        }
        acmod->senone_active_vec[(int)(local_6c / 0x20)] =
             acmod->senone_active_vec[(int)(local_6c / 0x20)] | (uint)(1L << (bVar1 & 0x1f));
      }
      if (hmm->senid[1] != 0xffff) {
        if (hmm->senid[1] == 0xffff) {
          bVar1 = 0xff;
        }
        else {
          bVar1 = (byte)hmm->ctx->sseq[hmm->senid[1]][1];
        }
        if (hmm->senid[1] == 0xffff) {
          local_84 = 0xffff;
        }
        else {
          local_84 = (uint)hmm->ctx->sseq[hmm->senid[1]][1];
        }
        acmod->senone_active_vec[(int)(local_84 / 0x20)] =
             acmod->senone_active_vec[(int)(local_84 / 0x20)] | (uint)(1L << (bVar1 & 0x1f));
      }
      if (hmm->senid[0] != 0xffff) {
        if (hmm->senid[0] == 0xffff) {
          bVar1 = 0xff;
        }
        else {
          bVar1 = (byte)*hmm->ctx->sseq[hmm->senid[0]];
        }
        if (hmm->senid[0] == 0xffff) {
          local_9c = 0xffff;
        }
        else {
          local_9c = (uint)*hmm->ctx->sseq[hmm->senid[0]];
        }
        acmod->senone_active_vec[(int)(local_9c / 0x20)] =
             acmod->senone_active_vec[(int)(local_9c / 0x20)] | (uint)(1L << (bVar1 & 0x1f));
      }
    }
  }
  return;
}

Assistant:

void
acmod_activate_hmm(acmod_t *acmod, hmm_t *hmm)
{
    int i;

    if (acmod->compallsen)
        return;
    if (hmm_is_mpx(hmm)) {
        switch (hmm_n_emit_state(hmm)) {
        case 5:
            MPX_BITVEC_SET(acmod, hmm, 4);
            MPX_BITVEC_SET(acmod, hmm, 3);
            /* FALLTHRU */
        case 3:
            MPX_BITVEC_SET(acmod, hmm, 2);
            MPX_BITVEC_SET(acmod, hmm, 1);
            MPX_BITVEC_SET(acmod, hmm, 0);
            break;
        default:
            for (i = 0; i < hmm_n_emit_state(hmm); ++i) {
                MPX_BITVEC_SET(acmod, hmm, i);
            }
        }
    }
    else {
        switch (hmm_n_emit_state(hmm)) {
        case 5:
            NONMPX_BITVEC_SET(acmod, hmm, 4);
            NONMPX_BITVEC_SET(acmod, hmm, 3);
            /* FALLTHRU */
        case 3:
            NONMPX_BITVEC_SET(acmod, hmm, 2);
            NONMPX_BITVEC_SET(acmod, hmm, 1);
            NONMPX_BITVEC_SET(acmod, hmm, 0);
            break;
        default:
            for (i = 0; i < hmm_n_emit_state(hmm); ++i) {
                NONMPX_BITVEC_SET(acmod, hmm, i);
            }
        }
    }
}